

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O1

string_view
slang::ast::SemanticFacts::getTypeRestrictionText(ForwardTypeRestriction typeRestriction)

{
  char *pcVar1;
  string_view sVar2;
  string_view sVar3;
  string_view sVar4;
  string_view sVar5;
  
  switch(typeRestriction) {
  case Enum:
    sVar2._M_str = "enum";
    sVar2._M_len = 4;
    return sVar2;
  case Struct:
    sVar5._M_str = "struct";
    sVar5._M_len = 6;
    return sVar5;
  case Union:
    pcVar1 = "union";
    break;
  case Class:
    pcVar1 = "class";
    break;
  case InterfaceClass:
    sVar3._M_str = "interface class";
    sVar3._M_len = 0xf;
    return sVar3;
  default:
    return (string_view)(ZEXT816(0x4ffe75) << 0x40);
  }
  sVar4._M_str = pcVar1;
  sVar4._M_len = 5;
  return sVar4;
}

Assistant:

std::string_view SemanticFacts::getTypeRestrictionText(ForwardTypeRestriction typeRestriction) {
    switch (typeRestriction) {
        case ForwardTypeRestriction::Enum:
            return "enum"sv;
        case ForwardTypeRestriction::Struct:
            return "struct"sv;
        case ForwardTypeRestriction::Union:
            return "union"sv;
        case ForwardTypeRestriction::Class:
            return "class"sv;
        case ForwardTypeRestriction::InterfaceClass:
            return "interface class"sv;
        default:
            return ""sv;
    }
}